

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasm.c
# Opt level: O0

void FreeDicoTree(s_assenv *ae)

{
  int local_14;
  int i;
  s_assenv *ae_local;
  
  for (local_14 = 0; local_14 < 0x100; local_14 = local_14 + 1) {
    if ((ae->dicotree).radix[local_14] != (s_crcdico_tree *)0x0) {
      FreeDicoTreeRecurse((ae->dicotree).radix[local_14]);
    }
  }
  if ((ae->dicotree).mdico != 0) {
    free((ae->dicotree).dico);
  }
  return;
}

Assistant:

void FreeDicoTree(struct s_assenv *ae)
{
	#undef FUNC
	#define FUNC "FreeDicoTree"

	int i;

	for (i=0;i<256;i++) {
		if (ae->dicotree.radix[i]) {
			FreeDicoTreeRecurse(ae->dicotree.radix[i]);
		}
	}
	if (ae->dicotree.mdico) MemFree(ae->dicotree.dico);
}